

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

bool __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::try_increase_info(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = this->mInfoInc;
  if (2 < uVar1) {
    this->mInfoInc = uVar1 >> 1 & 0xff;
    this->mInfoHashShift = this->mInfoHashShift + 1;
    uVar6 = this->mMask + 1;
    if (uVar6 < 0x28f5c28f5c28f5d) {
      uVar5 = (uVar6 * 0x50) / 100;
    }
    else {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6 >> 2;
      uVar5 = (SUB168(auVar2 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
    }
    uVar4 = 0xff;
    if (uVar5 < 0xff) {
      uVar4 = uVar5;
    }
    uVar4 = uVar4 + uVar6;
    if (uVar4 != 0) {
      uVar6 = 0;
      do {
        *(ulong *)(this->mInfo + uVar6) = *(ulong *)(this->mInfo + uVar6) >> 1 & 0x7f7f7f7f7f7f7f7f;
        uVar6 = uVar6 + 8;
      } while (uVar6 < uVar4);
    }
    this->mInfo[uVar4] = '\x01';
    uVar6 = this->mMask + 1;
    if (uVar6 < 0x28f5c28f5c28f5d) {
      uVar6 = (uVar6 * 0x50) / 100;
    }
    else {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar6 >> 2;
      uVar6 = (SUB168(auVar3 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
    }
    this->mMaxNumElementsAllowed = uVar6;
  }
  return 2 < uVar1;
}

Assistant:

bool try_increase_info() {
        ROBIN_HOOD_LOG("mInfoInc=" << mInfoInc << ", numElements=" << mNumElements
                                   << ", maxNumElementsAllowed="
                                   << calcMaxNumElementsAllowed(mMask + 1))
        if (mInfoInc <= 2) {
            // need to be > 2 so that shift works (otherwise undefined behavior!)
            return false;
        }
        // we got space left, try to make info smaller
        mInfoInc = static_cast<uint8_t>(mInfoInc >> 1U);

        // remove one bit of the hash, leaving more space for the distance info.
        // This is extremely fast because we can operate on 8 bytes at once.
        ++mInfoHashShift;
        auto const numElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        for (size_t i = 0; i < numElementsWithBuffer; i += 8) {
            auto val = unaligned_load<uint64_t>(mInfo + i);
            val = (val >> 1U) & UINT64_C(0x7f7f7f7f7f7f7f7f);
            std::memcpy(mInfo + i, &val, sizeof(val));
        }
        // update sentinel, which might have been cleared out!
        mInfo[numElementsWithBuffer] = 1;

        mMaxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        return true;
    }